

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_iter.cpp
# Opt level: O3

void __thiscall
ON_SubDVertexIterator::ON_SubDVertexIterator
          (ON_SubDVertexIterator *this,ON_SubD *subd,ON_SubDVertex *vertex)

{
  Type TVar1;
  ON_SubDComponentPtr *this_00;
  ON_SubDRef OStack_38;
  ON_SubDComponentPtr local_28;
  
  ON_SubDRef::ON_SubDRef(&this->m_subd_ref);
  this->m_v_current = (ON_SubDVertex *)0x0;
  this->m_vertex_index = 0;
  this->m_vertex_count = 0;
  this->m_v_first = (ON_SubDVertex *)0x0;
  this->m_v_last = (ON_SubDVertex *)0x0;
  (this->m_component_ptr).m_ptr = 0;
  ON_SubDRef::CreateReferenceForExperts(&OStack_38,subd);
  local_28 = (ON_SubDComponentPtr)0;
  ON_SubDRef::operator=(&this->m_subd_ref,&OStack_38);
  this->m_v_first = vertex;
  this->m_v_last = vertex;
  this->m_v_current = vertex;
  this->m_vertex_count = 1;
  this_00 = &local_28;
  TVar1 = ON_SubDComponentPtr::ComponentType(this_00);
  if (TVar1 == Unset) {
    this_00 = &ON_SubDComponentPtr::Null;
  }
  (this->m_component_ptr).m_ptr = this_00->m_ptr;
  ON_SubDRef::~ON_SubDRef(&OStack_38);
  return;
}

Assistant:

ON_SubDVertexIterator::ON_SubDVertexIterator(
  const ON_SubD& subd,
  const ON_SubDVertex& vertex
  )
{
  Internal_Init(
    ON_SubDRef::CreateReferenceForExperts(subd),
    1,
    &vertex,
    &vertex,
    ON_SubDComponentPtr::Null
  );
}